

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack3_8(uint32_t *in,uint32_t *out)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined8 uVar7;
  
  auVar3 = vpbroadcastd_avx512vl();
  auVar1 = vpsrlvd_avx2(auVar3,_DAT_00199ea0);
  auVar2 = vpsrlvd_avx2(auVar3,_DAT_00199eb0);
  auVar4 = valignd_avx512vl(ZEXT1632(auVar1),ZEXT1632(auVar1),7);
  auVar4 = vpblendd_avx2(auVar4,ZEXT1632(auVar3),1);
  auVar5 = vpbroadcastd_avx512vl();
  auVar4 = vpblendd_avx2(auVar4,auVar5,0x20);
  uVar7 = auVar2._0_8_;
  auVar6._8_8_ = uVar7;
  auVar6._0_8_ = uVar7;
  auVar6._16_8_ = uVar7;
  auVar6._24_8_ = uVar7;
  auVar4 = vpblendd_avx2(auVar4,auVar6,0xc0);
  auVar5._8_4_ = 7;
  auVar5._0_8_ = 0x700000007;
  auVar5._12_4_ = 7;
  auVar5._16_4_ = 7;
  auVar5._20_4_ = 7;
  auVar5._24_4_ = 7;
  auVar5._28_4_ = 7;
  auVar4 = vpandd_avx512vl(auVar4,auVar5);
  *(undefined1 (*) [32])out = auVar4;
  return in + 1;
}

Assistant:

const uint32_t *__fastunpack3_8(const uint32_t *__restrict__ in,
                                uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 3);
  out++;
  *out = ((*in) >> 3) % (1U << 3);
  out++;
  *out = ((*in) >> 6) % (1U << 3);
  out++;
  *out = ((*in) >> 9) % (1U << 3);
  out++;
  *out = ((*in) >> 12) % (1U << 3);
  out++;
  *out = ((*in) >> 15) % (1U << 3);
  out++;
  *out = ((*in) >> 18) % (1U << 3);
  out++;
  *out = ((*in) >> 21) % (1U << 3);
  out++;

  return in + 1;
}